

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O2

unique_ptr<disruptor::SequenceBarrier<disruptor::BusySpinStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BusySpinStrategy>_>_>
 __thiscall
disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
NewBarrier(Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *this,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents)

{
  SequenceBarrier<disruptor::BusySpinStrategy> *this_00;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_RDX;
  
  this_00 = (SequenceBarrier<disruptor::BusySpinStrategy> *)operator_new(0x30);
  SequenceBarrier<disruptor::BusySpinStrategy>::SequenceBarrier
            (this_00,(BusySpinStrategy *)
                     &dependents[7].
                      super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
             (Sequence *)
             &dependents[1].
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
              _M_impl.super__Vector_impl_data._M_finish,in_RDX);
  *(SequenceBarrier<disruptor::BusySpinStrategy> **)&this->ring_buffer_ = this_00;
  return (__uniq_ptr_data<disruptor::SequenceBarrier<disruptor::BusySpinStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BusySpinStrategy>_>,_true,_true>
          )(__uniq_ptr_data<disruptor::SequenceBarrier<disruptor::BusySpinStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BusySpinStrategy>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<SequenceBarrier<W> > NewBarrier(
      const std::vector<Sequence*>& dependents) {
    std::unique_ptr<SequenceBarrier<W> > sb(
        new SequenceBarrier<W>(wait_strategy_, cursor_, dependents));
    return sb;
  }